

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav * drwav_open_write(drwav_data_format *pFormat,drwav_write_proc onWrite,drwav_seek_proc onSeek,
                        void *pUserData)

{
  drwav_bool32 dVar1;
  drwav *pWav;
  
  pWav = (drwav *)malloc(0x150);
  if (pWav != (drwav *)0x0) {
    dVar1 = drwav_init_write(pWav,pFormat,onWrite,onSeek,pUserData);
    if (dVar1 != 0) {
      return pWav;
    }
    free(pWav);
  }
  return (drwav *)0x0;
}

Assistant:

drwav* drwav_open_write(const drwav_data_format* pFormat, drwav_write_proc onWrite, drwav_seek_proc onSeek,
                        void* pUserData) {
    drwav* pWav = (drwav*)DRWAV_MALLOC(sizeof(*pWav));
    if (pWav == NULL) {
        return NULL;
    }

    if (!drwav_init_write(pWav, pFormat, onWrite, onSeek, pUserData)) {
        DRWAV_FREE(pWav);
        return NULL;
    }

    return pWav;
}